

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

TrackData *
GenerateKBIWeakSectorTrack
          (TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track,int weak_offset,
          int weak_size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Sector *pSVar4;
  Data *pDVar5;
  BitBuffer *bitstream;
  uchar local_201;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_200;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1f8;
  uchar *local_1f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  undefined1 local_1d8 [8];
  Data dataW;
  Sector *sectorW;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_198;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_190;
  Data local_188;
  allocator<unsigned_char> local_169;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_168;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_160;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_158;
  Data local_150;
  byte local_131;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_130;
  bool is_weak;
  Data *data_copy;
  Sector *sector;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  undefined1 local_100 [4];
  int sectors;
  BitstreamTrackBuilder bitbuf;
  undefined1 local_70 [8];
  FluxTrackBuilder fluxbuf;
  int weak_size_local;
  int weak_offset_local;
  Track *track_local;
  CylHead *cylhead_local;
  TrackData *trackdata;
  
  fluxbuf._64_4_ = weak_size;
  fluxbuf._68_4_ = weak_offset;
  FluxTrackBuilder::FluxTrackBuilder((FluxTrackBuilder *)local_70,cylhead,_250K,MFM);
  TrackBuilder::addTrackStart((TrackBuilder *)local_70,false);
  BitstreamTrackBuilder::BitstreamTrackBuilder((BitstreamTrackBuilder *)local_100,_250K,MFM);
  TrackBuilder::addTrackStart((TrackBuilder *)local_100,false);
  iVar2 = Track::size(track);
  __end1 = Track::begin(track);
  sector = (Sector *)Track::end(track);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                     *)&sector), bVar1) {
    data_copy = (Data *)__gnu_cxx::
                        __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                        ::operator*(&__end1);
    pvStack_130 = &Sector::data_copy((Sector *)data_copy,0)->
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_131 = *(int *)((long)&(data_copy->
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 4) == 1;
    if ((bool)local_131) {
      TrackBuilder::addSectorUpToData
                ((TrackBuilder *)local_70,(Header *)data_copy,
                 *(uint8_t *)
                  &data_copy[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      local_158._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvStack_130);
      local_168._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvStack_130);
      local_160 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_168,(long)(int)fluxbuf._68_4_);
      std::allocator<unsigned_char>::allocator(&local_169);
      Data::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (&local_150,local_158,local_160,&local_169);
      TrackBuilder::addBlock((TrackBuilder *)local_70,&local_150);
      Data::~Data(&local_150);
      std::allocator<unsigned_char>::~allocator(&local_169);
      FluxTrackBuilder::addWeakBlock((FluxTrackBuilder *)local_70,fluxbuf._64_4_);
      local_1a0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvStack_130);
      local_198 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_1a0,(long)(int)fluxbuf._68_4_);
      local_190 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_198,(long)(int)fluxbuf._64_4_);
      local_1b0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvStack_130);
      iVar3 = Sector::size((Sector *)data_copy);
      local_1a8 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_1b0,(long)iVar3);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&sectorW + 7));
      Data::
      vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (&local_188,local_190,local_1a8,(allocator<unsigned_char> *)((long)&sectorW + 7));
      TrackBuilder::addBlock((TrackBuilder *)local_70,&local_188);
      Data::~Data(&local_188);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&sectorW + 7));
    }
    else {
      TrackBuilder::addSector
                ((TrackBuilder *)local_70,(Header *)data_copy,(Data *)pvStack_130,0x54,
                 *(uint8_t *)
                  &data_copy[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,false);
    }
    TrackBuilder::addSector
              ((TrackBuilder *)local_100,(Header *)data_copy,(Data *)pvStack_130,1,
               *(uint8_t *)
                &data_copy[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,(bool)(local_131 & 1));
    pDVar5 = data_copy;
    pSVar4 = Track::operator[](track,((iVar2 + -1) - (iVar2 + -1 >> 0x1f) >> 1) + -1);
    if ((Sector *)pDVar5 == pSVar4) {
      dataW.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)Track::operator[](track,iVar2 + -1);
      pDVar5 = Sector::data_copy((Sector *)
                                 dataW.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      Data::Data((Data *)local_1d8,pDVar5);
      local_1e8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
      local_1e0 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_1e8,(long)(int)fluxbuf._68_4_);
      local_200._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
      local_1f8 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_200,(long)(int)fluxbuf._68_4_);
      local_1f0 = (uchar *)__gnu_cxx::
                           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::operator+(&local_1f8,(long)(int)fluxbuf._64_4_);
      local_201 = 0xee;
      std::
      fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                (local_1e0,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_1f0,&local_201);
      TrackBuilder::addSector
                ((TrackBuilder *)local_100,
                 (Header *)
                 dataW.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(Data *)local_1d8,1,
                 dataW.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[0x20],true);
      Data::~Data((Data *)local_1d8);
    }
    __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&__end1);
  }
  TrackData::TrackData(__return_storage_ptr__,cylhead);
  bitstream = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_100);
  TrackData::add(__return_storage_ptr__,bitstream);
  BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)local_100);
  FluxTrackBuilder::~FluxTrackBuilder((FluxTrackBuilder *)local_70);
  return __return_storage_ptr__;
}

Assistant:

TrackData GenerateKBIWeakSectorTrack(const CylHead& cylhead, const Track& track, int weak_offset, int weak_size)
{
#ifdef _DEBUG
    int temp_offset, temp_size;
    assert(IsKBIWeakSectorTrack(track, temp_offset, temp_size));
    assert(weak_offset == temp_offset && weak_size == temp_size);
#endif

    FluxTrackBuilder fluxbuf(cylhead, DataRate::_250K, Encoding::MFM);
    fluxbuf.addTrackStart();

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    auto sectors = track.size();
    for (auto& sector : track)
    {
        auto& data_copy = sector.data_copy();
        auto is_weak = sector.header.size == 1;

        if (!is_weak)
            fluxbuf.addSector(sector.header, data_copy, 0x54, sector.dam);
        else
        {
            fluxbuf.addSectorUpToData(sector.header, sector.dam);
            fluxbuf.addBlock(Data(data_copy.begin(), data_copy.begin() + weak_offset));
            fluxbuf.addWeakBlock(weak_size);
            fluxbuf.addBlock(Data(
                data_copy.begin() + weak_offset + weak_size,
                data_copy.begin() + sector.size()));
        }

        bitbuf.addSector(sector.header, data_copy, 1, sector.dam, is_weak);

        // Insert the duplicate sector earlier on the track.
        if (&sector == &track[((sectors - 1) / 2) - 1])
        {
            auto& sectorW = track[sectors - 1];
            auto dataW{ sectorW.data_copy() };
            std::fill(dataW.begin() + weak_offset, dataW.begin() + weak_offset + weak_size, uint8_t(0xee));
            bitbuf.addSector(sectorW.header, dataW, 1, sectorW.dam, true);
        }
    }

    TrackData trackdata(cylhead);
    trackdata.add(std::move(bitbuf.buffer()));
    //trackdata.add(FluxData({ fluxbuf.buffer() }));
    return trackdata;
}